

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void ZSTDMT_freeJobsTable(ZSTDMT_jobDescription *jobTable,U32 nbJobs,ZSTD_customMem cMem)

{
  code *UNRECOVERED_JUMPTABLE;
  ulong uVar1;
  pthread_cond_t *__cond;
  
  if (jobTable == (ZSTDMT_jobDescription *)0x0) {
    return;
  }
  if (nbJobs != 0) {
    uVar1 = (ulong)nbJobs;
    __cond = (pthread_cond_t *)&jobTable->job_cond;
    do {
      pthread_mutex_destroy((pthread_mutex_t *)((long)__cond + -0x28));
      pthread_cond_destroy(__cond);
      __cond = (pthread_cond_t *)((long)__cond + 0x1b8);
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
    (*UNRECOVERED_JUMPTABLE)();
    return;
  }
  free(jobTable);
  return;
}

Assistant:

static void ZSTDMT_freeJobsTable(ZSTDMT_jobDescription* jobTable, U32 nbJobs, ZSTD_customMem cMem)
{
    U32 jobNb;
    if (jobTable == NULL) return;
    for (jobNb=0; jobNb<nbJobs; jobNb++) {
        ZSTD_pthread_mutex_destroy(&jobTable[jobNb].job_mutex);
        ZSTD_pthread_cond_destroy(&jobTable[jobNb].job_cond);
    }
    ZSTD_customFree(jobTable, cMem);
}